

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_streamable<trng::zero_truncated_poisson_dist>
               (zero_truncated_poisson_dist *d)

{
  StringRef capturedExpression;
  AssertionHandler *this;
  ExprLhs<const_trng::zero_truncated_poisson_dist_&> expr;
  zero_truncated_poisson_dist *in_RDI;
  AssertionHandler catchAssertionHandler;
  zero_truncated_poisson_dist d_new;
  stringstream str;
  param_type p_new;
  param_type *in_stack_fffffffffffffd48;
  zero_truncated_poisson_dist *in_stack_fffffffffffffd50;
  AssertionHandler *this_00;
  StringRef *macroName;
  param_type *in_stack_fffffffffffffd68;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd70;
  zero_truncated_poisson_dist *in_stack_fffffffffffffd80;
  param_type *in_stack_fffffffffffffd88;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  AssertionHandler local_248 [2];
  stringstream local_1b0 [16];
  StringRef local_1a0 [25];
  zero_truncated_poisson_dist *local_8;
  
  local_8 = in_RDI;
  trng::zero_truncated_poisson_dist::param_type::param_type((param_type *)0x39253c);
  std::__cxx11::stringstream::stringstream(local_1b0);
  macroName = local_1a0;
  this = (AssertionHandler *)trng::zero_truncated_poisson_dist::param(local_8);
  trng::operator<<(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  trng::operator>>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  trng::zero_truncated_poisson_dist::zero_truncated_poisson_dist
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  local_248[0].m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
  this_00 = local_248;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x127);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd70;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffd68;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  expr = Catch::Decomposer::operator<=
                   ((Decomposer *)in_stack_fffffffffffffd48,(zero_truncated_poisson_dist *)0x392638)
  ;
  Catch::ExprLhs<trng::zero_truncated_poisson_dist_const&>::operator==
            ((ExprLhs<const_trng::zero_truncated_poisson_dist_&> *)in_stack_fffffffffffffd88,
             in_stack_fffffffffffffd80);
  Catch::AssertionHandler::handleExpr(this_00,(ITransientExpression *)expr.m_lhs);
  Catch::
  BinaryExpr<const_trng::zero_truncated_poisson_dist_&,_const_trng::zero_truncated_poisson_dist_&>::
  ~BinaryExpr((BinaryExpr<const_trng::zero_truncated_poisson_dist_&,_const_trng::zero_truncated_poisson_dist_&>
               *)0x39267e);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  trng::zero_truncated_poisson_dist::~zero_truncated_poisson_dist
            ((zero_truncated_poisson_dist *)0x392752);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  trng::zero_truncated_poisson_dist::param_type::~param_type((param_type *)0x39276c);
  return;
}

Assistant:

void discrete_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE(d == d_new);
}